

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# res012.c
# Opt level: O3

vorbis_look_residue * res0_look(vorbis_dsp_state *vd,vorbis_info_mode *vm,vorbis_info_residue *vr)

{
  uint uVar1;
  undefined8 uVar2;
  uint uVar3;
  undefined8 *puVar4;
  void *pvVar5;
  void *pvVar6;
  ulong uVar7;
  void *pvVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  long lVar12;
  long lVar13;
  int iVar14;
  ulong uVar15;
  size_t sVar16;
  uint uVar17;
  ulong uVar18;
  int iVar19;
  size_t __nmemb;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  uint local_58;
  
  puVar4 = (undefined8 *)calloc(1,0x40);
  pvVar8 = vd->vi->codec_setup;
  *puVar4 = vr;
  *(int *)(puVar4 + 1) = vm->mapping;
  uVar1 = *(uint *)((long)vr + 0x14);
  __nmemb = (size_t)(int)uVar1;
  *(uint *)((long)puVar4 + 0xc) = uVar1;
  lVar13 = *(long *)((long)pvVar8 + 0x1428);
  puVar4[3] = lVar13;
  lVar12 = (long)*(int *)((long)vr + 0x18) * 0x60;
  puVar4[4] = lVar13 + lVar12;
  uVar2 = *(undefined8 *)(lVar13 + lVar12);
  pvVar5 = calloc(__nmemb,8);
  puVar4[5] = pvVar5;
  if ((long)__nmemb < 1) {
    uVar17 = 0;
  }
  else {
    sVar16 = 0;
    uVar17 = 0;
    iVar19 = 0;
    do {
      uVar21 = *(uint *)((long)vr + sVar16 * 4 + 0x1c);
      if (uVar21 != 0) {
        uVar3 = 0x1f;
        if (uVar21 != 0) {
          for (; uVar21 >> uVar3 == 0; uVar3 = uVar3 - 1) {
          }
        }
        uVar3 = (uVar3 ^ 0xffffffe0) + 0x21;
        pvVar6 = calloc((ulong)uVar3,8);
        *(void **)((long)pvVar5 + sVar16 * 8) = pvVar6;
        uVar7 = 0;
        do {
          if ((uVar21 >> ((uint)uVar7 & 0x1f) & 1) != 0) {
            lVar13 = (long)iVar19;
            iVar19 = iVar19 + 1;
            *(long *)(*(long *)((long)pvVar5 + sVar16 * 8) + uVar7 * 8) =
                 (long)*(int *)((long)vr + lVar13 * 4 + 0x11c) * 0x60 +
                 *(long *)((long)pvVar8 + 0x1428);
          }
          uVar7 = uVar7 + 1;
        } while (uVar3 != uVar7);
        if ((int)uVar17 < (int)uVar3) {
          uVar17 = uVar3;
        }
      }
      sVar16 = sVar16 + 1;
    } while (sVar16 != __nmemb);
  }
  *(uint *)(puVar4 + 6) = uVar1;
  local_58 = (uint)uVar2;
  sVar16 = __nmemb;
  uVar21 = uVar1;
  if (1 < (int)local_58) {
    uVar9 = local_58 - 2;
    uVar28 = 1;
    uVar3 = 1;
    uVar29 = 1;
    iVar19 = 4;
    do {
      uVar24 = uVar29;
      uVar23 = uVar3;
      uVar22 = uVar28;
      uVar20 = uVar21;
      uVar21 = uVar20 * uVar1;
      uVar3 = uVar23 * uVar1;
      uVar28 = uVar22 * uVar1;
      uVar29 = uVar24 * uVar1;
      iVar10 = iVar19 + -4;
      iVar14 = iVar19 + (local_58 + 2 & 0xfffffffc);
      iVar19 = iVar10;
    } while (iVar14 != 8);
    uVar11 = -iVar10;
    uVar25 = -(uint)((int)(uVar9 ^ 0x80000000) < (int)(uVar11 ^ 0x80000000));
    uVar26 = -(uint)((int)(uVar9 ^ 0x80000000) < (int)((uVar11 | 1) ^ 0x80000000));
    uVar27 = -(uint)((int)(uVar9 ^ 0x80000000) < (int)((uVar11 | 2) ^ 0x80000000));
    uVar9 = -(uint)((int)(uVar9 ^ 0x80000000) < (int)((uVar11 | 3) ^ 0x80000000));
    uVar21 = (~uVar27 & uVar3 | uVar23 & uVar27) * (~uVar25 & uVar21 | uVar20 & uVar25) *
             (~uVar26 & uVar28 | uVar22 & uVar26) * (~uVar9 & uVar29 | uVar24 & uVar9);
    *(uint *)(puVar4 + 6) = uVar21;
    sVar16 = (size_t)(int)uVar21;
  }
  *(uint *)(puVar4 + 2) = uVar17;
  pvVar8 = malloc(sVar16 << 3);
  puVar4[7] = pvVar8;
  if (0 < (int)uVar21) {
    uVar7 = 0;
    do {
      pvVar5 = malloc((long)(int)local_58 * 4);
      *(void **)((long)pvVar8 + uVar7 * 8) = pvVar5;
      if (0 < (int)local_58) {
        uVar18 = 0;
        uVar15 = uVar7;
        lVar13 = (long)((int)uVar21 / (int)uVar1);
        do {
          lVar12 = (long)uVar15 / lVar13;
          uVar15 = (long)uVar15 % lVar13;
          lVar13 = lVar13 / (long)__nmemb;
          *(int *)((long)pvVar5 + uVar18 * 4) = (int)lVar12;
          uVar18 = uVar18 + 1;
        } while ((local_58 & 0x7fffffff) != uVar18);
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != uVar21);
  }
  return puVar4;
}

Assistant:

vorbis_look_residue *res0_look(vorbis_dsp_state *vd,vorbis_info_mode *vm,
			  vorbis_info_residue *vr){
  vorbis_info_residue0 *info=(vorbis_info_residue0 *)vr;
  vorbis_look_residue0 *look=(vorbis_look_residue0 *)_ogg_calloc(1,sizeof(*look));
  codec_setup_info     *ci=(codec_setup_info *)vd->vi->codec_setup;

  int j,k,acc=0;
  int dim;
  int maxstage=0;
  look->info=info;
  look->map=vm->mapping;

  look->parts=info->partitions;
  look->fullbooks=ci->fullbooks;
  look->phrasebook=ci->fullbooks+info->groupbook;
  dim=look->phrasebook->dim;

  look->partbooks=(codebook ***)_ogg_calloc(look->parts,sizeof(*look->partbooks));

  for(j=0;j<look->parts;j++){
    int stages=ilog(info->secondstages[j]);
    if(stages){
      if(stages>maxstage)maxstage=stages;
      look->partbooks[j]=(codebook **)_ogg_calloc(stages,sizeof(*look->partbooks[j]));
      for(k=0;k<stages;k++)
	if(info->secondstages[j]&(1<<k)){
	  look->partbooks[j][k]=ci->fullbooks+info->booklist[acc++];
#ifdef TRAIN_RES
	  look->training_data[k][j]=calloc(look->partbooks[j][k]->entries,
					   sizeof(***look->training_data));
#endif
	}
    }
  }

  look->partvals=look->parts;
  for(j=1;j<dim;j++)look->partvals*=look->parts;
  look->stages=maxstage;
  look->decodemap=(int **)_ogg_malloc(look->partvals*sizeof(*look->decodemap));
  for(j=0;j<look->partvals;j++){
    long val=j;
    long mult=look->partvals/look->parts;
    look->decodemap[j]=(int *)_ogg_malloc(dim*sizeof(*look->decodemap[j]));
    for(k=0;k<dim;k++){
      long deco=val/mult;
      val-=deco*mult;
      mult/=look->parts;
      look->decodemap[j][k]=deco;
    }
  }

  return(look);
}